

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setRootPrePartials
          (BeagleCPUImpl<float,_1,_0> *this,int *bufferIndices,int *stateFrequenciesIndices,
          int count)

{
  float **ppfVar1;
  float *__src;
  int iVar2;
  float *pfVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  
  iVar5 = -7;
  if ((count == 1) && (iVar5 = -7, this->kAutoRootPartitioningEnabled == false)) {
    lVar8 = (long)*bufferIndices;
    iVar5 = -5;
    if ((-1 < lVar8) && (*bufferIndices < *(int *)&(this->super_BeagleImpl).field_0xc)) {
      ppfVar1 = this->gPartials;
      iVar5 = *stateFrequenciesIndices;
      pfVar3 = ppfVar1[lVar8];
      if (pfVar3 == (float *)0x0) {
        pfVar3 = (float *)malloc((long)this->kPartialsSize << 2);
        ppfVar1[lVar8] = pfVar3;
        pfVar3 = this->gPartials[lVar8];
        if (pfVar3 == (float *)0x0) {
          return -2;
        }
      }
      if (0 < this->kCategoryCount) {
        iVar4 = 0;
        __src = this->gStateFrequencies[iVar5];
        iVar5 = this->kPatternCount;
        do {
          if (iVar5 < 1) {
            iVar2 = this->kPartialsPaddedStateCount;
          }
          else {
            iVar6 = 0;
            do {
              memcpy(pfVar3,__src,(ulong)(uint)this->kStateCount << 2);
              iVar2 = this->kPartialsPaddedStateCount;
              iVar5 = this->kPatternCount;
              iVar6 = iVar6 + 1;
              pfVar3 = pfVar3 + iVar2;
            } while (iVar6 < iVar5);
          }
          uVar7 = (this->kPaddedPatternCount - iVar5) * iVar2;
          if (0 < (int)uVar7) {
            memset(pfVar3,0,(ulong)uVar7 << 2);
            pfVar3 = pfVar3 + (ulong)(uVar7 - 1) + 1;
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 < this->kCategoryCount);
      }
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setRootPrePartials(const int *bufferIndices,
                                                          const int *stateFrequenciesIndices,
                                                          int count) {
    if (count == 1) {
        // We treat this as a special case so that we don't have convoluted logic
        //      at the end of the loop over patterns
        if (kAutoRootPartitioningEnabled) {
//            calcRootLogLikelihoodsByAutoPartitionAsync(bufferIndices,
//                                                       categoryWeightsIndices,
//                                                       stateFrequenciesIndices,
//                                                       cumulativeScaleIndices,
//                                                       gAutoPartitionIndices,
//                                                       gAutoPartitionOutSumLogLikelihoods);
//
//            *outSumLogLikelihood = 0.0;
//
//            for (int i = 0; i < kPartitionCount; i++) {
//                *outSumLogLikelihood += gAutoPartitionOutSumLogLikelihoods[i];
//            }
//
//            if (*outSumLogLikelihood != *outSumLogLikelihood) {
//                return BEAGLE_ERROR_FLOATING_POINT;
//            } else {
//                return BEAGLE_SUCCESS;
//            }
            return BEAGLE_ERROR_NO_IMPLEMENTATION;
        } else {
            int stateFrequenciesIndex = stateFrequenciesIndices[0];
            int bufferIndex = bufferIndices[0];
            if (bufferIndex < 0 || bufferIndex >= kBufferCount)
                return BEAGLE_ERROR_OUT_OF_RANGE;
            if (gPartials[bufferIndex] == NULL) {
                gPartials[bufferIndex] = (REALTYPE *) malloc(sizeof(REALTYPE) * kPartialsSize);
                if (gPartials[bufferIndex] == 0L)
                    return BEAGLE_ERROR_OUT_OF_MEMORY;
            }
            const REALTYPE *inPartialsOffset = gStateFrequencies[stateFrequenciesIndex];
            REALTYPE *tmpRealPartialsOffset = gPartials[bufferIndex];
            for (int l = 0; l < kCategoryCount; l++) {
                for (int i = 0; i < kPatternCount; i++) {
                    beagleMemCpy(tmpRealPartialsOffset, inPartialsOffset, kStateCount);
                    tmpRealPartialsOffset += kPartialsPaddedStateCount;
                }
                // Pad extra buffer with zeros
                for (int k = 0; k < kPartialsPaddedStateCount * (kPaddedPatternCount - kPatternCount); k++) {
                    *tmpRealPartialsOffset++ = 0;
                }
            }

            return BEAGLE_SUCCESS;
        }
        return BEAGLE_ERROR_NO_IMPLEMENTATION;
    }
    return BEAGLE_ERROR_NO_IMPLEMENTATION;

}